

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,int index,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  NetPrivate *pNVar1;
  int iVar2;
  pointer pcVar3;
  uint uVar4;
  custom_layer_registry_entry dummy;
  
  uVar4 = index & 0xfffffeff;
  if (uVar4 == index) {
    fprintf(_stderr,"can not register build-in layer index %d",index);
    fputc(10,_stderr);
    iVar2 = -1;
  }
  else {
    pNVar1 = this->d;
    pcVar3 = (pNVar1->custom_layer_registry).
             super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pNVar1->custom_layer_registry).
                            super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) >> 5) <=
        (int)uVar4) {
      dummy.destroyer = (layer_destroyer_func)0x0;
      dummy.userdata = (void *)0x0;
      dummy.name = "";
      dummy.creator = (layer_creator_func)0x0;
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::resize(&pNVar1->custom_layer_registry,(long)(int)(uVar4 + 1),&dummy);
      pcVar3 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (pcVar3[(int)uVar4].creator != (layer_creator_func)0x0) {
      fprintf(_stderr,"overwrite existing custom layer index %d",(ulong)uVar4);
      fputc(10,_stderr);
      pcVar3 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pcVar3[(int)uVar4].creator = creator;
    pcVar3[(int)uVar4].destroyer = destroyer;
    pcVar3[(int)uVar4].userdata = userdata;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Net::register_custom_layer(int index, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int custom_index = index & ~LayerType::CustomBit;
    if (index == custom_index)
    {
        NCNN_LOGE("can not register build-in layer index %d", custom_index);
        return -1;
    }

    if ((int)d->custom_layer_registry.size() <= custom_index)
    {
#if NCNN_STRING
        struct custom_layer_registry_entry dummy = {"", 0, 0, 0};
#else
        struct custom_layer_registry_entry dummy = {0, 0, 0};
#endif // NCNN_STRING
        d->custom_layer_registry.resize(custom_index + 1, dummy);
    }

    if (d->custom_layer_registry[custom_index].creator)
    {
        NCNN_LOGE("overwrite existing custom layer index %d", custom_index);
    }

    d->custom_layer_registry[custom_index].creator = creator;
    d->custom_layer_registry[custom_index].destroyer = destroyer;
    d->custom_layer_registry[custom_index].userdata = userdata;
    return 0;
}